

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcProcess::~IfcProcess(IfcProcess *this)

{
  IfcObject::~IfcObject(&this->super_IfcObject,&PTR_construction_vtable_24__0073a160);
  return;
}

Assistant:

IfcProcess() : Object("IfcProcess") {}